

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

bool anon_unknown.dwarf_1ee9f1::checkPixels<half>
               (Array2D<half> *ph,int lx,int rx,int ly,int ry,int width)

{
  float fVar1;
  bool bVar2;
  ushort uVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float i;
  
  bVar2 = true;
  if (ly <= ry) {
    lVar6 = (long)ly * 2;
    iVar10 = ly * width;
    bVar2 = false;
    lVar8 = (long)ly;
    do {
      lVar7 = (long)lx;
      if (lx <= rx) {
        do {
          fVar1 = half::_toFloat
                  [*(unsigned_short *)((long)&ph->_data[lVar7]._h + ph->_sizeY * lVar6)].f;
          iVar9 = (iVar10 + (int)lVar7) % 0x801;
          i = (float)iVar9;
          if (iVar9 == 0) {
            uVar3 = (ushort)((uint)i >> 0x10);
          }
          else if (half::_eLut[(uint)i >> 0x17] == 0) {
            uVar3 = half::convert((int)i);
          }
          else {
            uVar3 = half::_eLut[(uint)i >> 0x17] +
                    (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd)
            ;
          }
          if ((fVar1 != half::_toFloat[uVar3].f) || (NAN(fVar1) || NAN(half::_toFloat[uVar3].f))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = operator<<(poVar4,(half)*(unsigned_short *)
                                              ((long)&ph->_data[lVar7]._h + lVar6 * ph->_sizeY));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar9);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            return bVar2;
          }
          lVar7 = lVar7 + 1;
        } while (rx + 1 != (int)lVar7);
      }
      lVar7 = lVar8 + 1;
      bVar2 = ry <= lVar8;
      lVar6 = lVar6 + 2;
      iVar10 = iVar10 + width;
      lVar8 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return bVar2;
}

Assistant:

bool checkPixels (Array2D<T> &ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T>(((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl << flush;
                return false;
            }
    return true;
}